

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ge.cpp
# Opt level: O2

void ge_double_scalarmult_vartime(ge_p2 *r,uchar *a,ge_p3 *A,uchar *b)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ge_p3 u;
  ge_p1p1 t;
  char bslide [256];
  char aslide [256];
  ge_cached Ai [8];
  ge_p3 A2;
  
  slide(aslide,a);
  slide(bslide,b);
  ge_p3_to_cached(Ai,A);
  ge_p3_dbl(&t,A);
  ge_p1p1_to_p3(&A2,&t);
  ge_add(&t,&A2,Ai);
  ge_p1p1_to_p3(&u,&t);
  ge_p3_to_cached(Ai + 1,&u);
  ge_add(&t,&A2,Ai + 1);
  ge_p1p1_to_p3(&u,&t);
  ge_p3_to_cached(Ai + 2,&u);
  ge_add(&t,&A2,Ai + 2);
  ge_p1p1_to_p3(&u,&t);
  ge_p3_to_cached(Ai + 3,&u);
  ge_add(&t,&A2,Ai + 3);
  ge_p1p1_to_p3(&u,&t);
  ge_p3_to_cached(Ai + 4,&u);
  ge_add(&t,&A2,Ai + 4);
  ge_p1p1_to_p3(&u,&t);
  ge_p3_to_cached(Ai + 5,&u);
  ge_add(&t,&A2,Ai + 5);
  ge_p1p1_to_p3(&u,&t);
  ge_p3_to_cached(Ai + 6,&u);
  ge_add(&t,&A2,Ai + 6);
  ge_p1p1_to_p3(&u,&t);
  ge_p3_to_cached(Ai + 7,&u);
  ge_p2_0(r);
  for (uVar2 = 0xff;
      ((uVar3 = 0xffffffff, -1 < (int)uVar2 && (uVar3 = uVar2, aslide[uVar2] == '\0')) &&
      (bslide[uVar2] == '\0')); uVar2 = uVar2 - 1) {
  }
  for (; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    ge_p2_dbl(&t,r);
    bVar1 = aslide[uVar3];
    if ((char)bVar1 < '\x01') {
      if ((char)bVar1 < '\0') {
        ge_p1p1_to_p3(&u,&t);
        ge_sub(&t,&u,Ai + ((byte)-bVar1 >> 1));
      }
    }
    else {
      ge_p1p1_to_p3(&u,&t);
      ge_add(&t,&u,Ai + (bVar1 >> 1));
    }
    bVar1 = bslide[uVar3];
    if ((char)bVar1 < '\x01') {
      if ((char)bVar1 < '\0') {
        ge_p1p1_to_p3(&u,&t);
        ge_msub(&t,&u,Bi + ((byte)-bVar1 >> 1));
      }
    }
    else {
      ge_p1p1_to_p3(&u,&t);
      ge_madd(&t,&u,Bi + (bVar1 >> 1));
    }
    ge_p1p1_to_p2(r,&t);
  }
  return;
}

Assistant:

void ge_double_scalarmult_vartime(ge_p2 *r, const unsigned char *a, const ge_p3 *A, const unsigned char *b) {
    signed char aslide[256];
    signed char bslide[256];
    ge_cached Ai[8]; /* A,3A,5A,7A,9A,11A,13A,15A */
    ge_p1p1 t;
    ge_p3 u;
    ge_p3 A2;
    int i;
    slide(aslide, a);
    slide(bslide, b);
    ge_p3_to_cached(&Ai[0], A);
    ge_p3_dbl(&t, A);
    ge_p1p1_to_p3(&A2, &t);
    ge_add(&t, &A2, &Ai[0]);
    ge_p1p1_to_p3(&u, &t);
    ge_p3_to_cached(&Ai[1], &u);
    ge_add(&t, &A2, &Ai[1]);
    ge_p1p1_to_p3(&u, &t);
    ge_p3_to_cached(&Ai[2], &u);
    ge_add(&t, &A2, &Ai[2]);
    ge_p1p1_to_p3(&u, &t);
    ge_p3_to_cached(&Ai[3], &u);
    ge_add(&t, &A2, &Ai[3]);
    ge_p1p1_to_p3(&u, &t);
    ge_p3_to_cached(&Ai[4], &u);
    ge_add(&t, &A2, &Ai[4]);
    ge_p1p1_to_p3(&u, &t);
    ge_p3_to_cached(&Ai[5], &u);
    ge_add(&t, &A2, &Ai[5]);
    ge_p1p1_to_p3(&u, &t);
    ge_p3_to_cached(&Ai[6], &u);
    ge_add(&t, &A2, &Ai[6]);
    ge_p1p1_to_p3(&u, &t);
    ge_p3_to_cached(&Ai[7], &u);
    ge_p2_0(r);

    for (i = 255; i >= 0; --i) {
        if (aslide[i] || bslide[i]) {
            break;
        }
    }

    for (; i >= 0; --i) {
        ge_p2_dbl(&t, r);

        if (aslide[i] > 0) {
            ge_p1p1_to_p3(&u, &t);
            ge_add(&t, &u, &Ai[aslide[i] / 2]);
        } else if (aslide[i] < 0) {
            ge_p1p1_to_p3(&u, &t);
            ge_sub(&t, &u, &Ai[(-aslide[i]) / 2]);
        }

        if (bslide[i] > 0) {
            ge_p1p1_to_p3(&u, &t);
            ge_madd(&t, &u, &Bi[bslide[i] / 2]);
        } else if (bslide[i] < 0) {
            ge_p1p1_to_p3(&u, &t);
            ge_msub(&t, &u, &Bi[(-bslide[i]) / 2]);
        }

        ge_p1p1_to_p2(r, &t);
    }
}